

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O1

void HBLAS3::hblas3_gemm_square_HH_TC_ZH_invoker(void)

{
  undefined8 uVar1;
  string local_288;
  undefined7 uStack_287;
  long local_278 [2];
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  ulong *puStack_a0;
  long lStack_98;
  ulong auStack_90 [2];
  ulong *local_80;
  long local_78;
  ulong *local_70;
  long local_68;
  ulong *local_60;
  long local_58;
  ulong *local_50;
  long local_48;
  ulong *local_40;
  long local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_220 = "";
  lStack_98 = 0;
  auStack_90[0] = 0;
  auStack_90[1] = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  puStack_a0 = (ulong *)0x0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
  lStack_98 = 0;
  auStack_90[0] = auStack_90[0] & 0xffffffffffffff00;
  local_288 = (string)0x22;
  puStack_a0 = auStack_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"hblas3_gemm_square_HH_TC_ZH",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_40 = puStack_a0;
  local_38 = (long)puStack_a0 + lStack_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x176);
  if (puStack_a0 != auStack_90) {
    operator_delete(puStack_a0,auStack_90[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
  std::ios_base::~ios_base((ios_base *)&uStack_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_230 = "";
  lStack_98 = 0;
  auStack_90[0] = 0;
  auStack_90[1] = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  puStack_a0 = (ulong *)0x0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
  lStack_98 = 0;
  auStack_90[0] = auStack_90[0] & 0xffffffffffffff00;
  local_288 = (string)0x22;
  puStack_a0 = auStack_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"hblas3_gemm_square_HH_TC_ZH",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_50 = puStack_a0;
  local_48 = (long)puStack_a0 + lStack_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x176);
  if (puStack_a0 != auStack_90) {
    operator_delete(puStack_a0,auStack_90[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
  std::ios_base::~ios_base((ios_base *)&uStack_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_240 = "";
  lStack_98 = 0;
  auStack_90[0] = 0;
  auStack_90[1] = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  puStack_a0 = (ulong *)0x0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
  lStack_98 = 0;
  auStack_90[0] = auStack_90[0] & 0xffffffffffffff00;
  local_288 = (string)0x22;
  puStack_a0 = auStack_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"hblas3_gemm_square_HH_TC_ZH",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_60 = puStack_a0;
  local_58 = (long)puStack_a0 + lStack_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x176);
  if (puStack_a0 != auStack_90) {
    operator_delete(puStack_a0,auStack_90[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
  std::ios_base::~ios_base((ios_base *)&uStack_1a8);
  hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,HAXX::quaternion<double>,(char)84,(char)67,100ul,100ul,100ul>
            ();
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_250 = "";
  lStack_98 = 0;
  auStack_90[0] = 0;
  auStack_90[1] = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  puStack_a0 = (ulong *)0x0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
  lStack_98 = 0;
  auStack_90[0] = auStack_90[0] & 0xffffffffffffff00;
  local_288 = (string)0x22;
  puStack_a0 = auStack_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"hblas3_gemm_square_HH_TC_ZH",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_70 = puStack_a0;
  local_68 = (long)puStack_a0 + lStack_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x176);
  if (puStack_a0 != auStack_90) {
    operator_delete(puStack_a0,auStack_90[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
  std::ios_base::~ios_base((ios_base *)&uStack_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_260 = "";
  lStack_98 = 0;
  auStack_90[0] = 0;
  auStack_90[1] = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  puStack_a0 = (ulong *)0x0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
  lStack_98 = 0;
  auStack_90[0] = auStack_90[0] & 0xffffffffffffff00;
  local_288 = (string)0x22;
  puStack_a0 = auStack_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"hblas3_gemm_square_HH_TC_ZH",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_80 = puStack_a0;
  local_78 = (long)puStack_a0 + lStack_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x176);
  if (puStack_a0 != auStack_90) {
    operator_delete(puStack_a0,auStack_90[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
  std::ios_base::~ios_base((ios_base *)&uStack_1a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas3_gemm_square_HH_TC_ZH) {
  hblas3_gemm<qd,qd,cd,qd,'T','C'>();
}